

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  int iVar1;
  PagerSavepoint *local_38;
  PagerSavepoint *pSavepoint;
  int local_20;
  int nNew;
  int ii;
  int rc;
  int iSavepoint_local;
  int op_local;
  Pager *pPager_local;
  
  nNew = pPager->errCode;
  if ((nNew == 0) && (iSavepoint < pPager->nSavepoint)) {
    iVar1 = iSavepoint + (uint)(op != 1);
    for (local_20 = iVar1; local_20 < pPager->nSavepoint; local_20 = local_20 + 1) {
      sqlite3BitvecDestroy(pPager->aSavepoint[local_20].pInSavepoint);
    }
    pPager->nSavepoint = iVar1;
    if (op == 1) {
      if ((iVar1 == 0) && (pPager->sjfd->pMethods != (sqlite3_io_methods *)0x0)) {
        iVar1 = sqlite3JournalIsInMemory(pPager->sjfd);
        if (iVar1 != 0) {
          nNew = sqlite3OsTruncate(pPager->sjfd,0);
        }
        pPager->nSubRec = 0;
      }
    }
    else if ((pPager->pWal != (Wal *)0x0) || (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0)) {
      if (iVar1 == 0) {
        local_38 = (PagerSavepoint *)0x0;
      }
      else {
        local_38 = pPager->aSavepoint + (iVar1 + -1);
      }
      nNew = pagerPlaybackSavepoint(pPager,local_38);
    }
  }
  return nNew;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;
  
#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated 
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* If this is a release of the outermost savepoint, truncate 
    ** the sub-journal to zero bytes in size. */
    if( op==SAVEPOINT_RELEASE ){
      if( nNew==0 && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          rc = sqlite3OsTruncate(pPager->sjfd, 0);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = 0;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }
    
#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled 
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if( 
        pPager->journalMode==PAGER_JOURNALMODE_OFF 
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}